

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.cc
# Opt level: O1

Position __thiscall
absl::cord_internal::CordRepBtreeNavigator::Skip(CordRepBtreeNavigator *this,size_t n)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  CordRepBtree *pCVar4;
  CordRepBtree *pCVar5;
  uint8_t uVar6;
  int iVar7;
  ulong uVar8;
  CordRepBtree *pCVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  Position PVar16;
  
  bVar1 = this->index_[0];
  uVar8 = (ulong)bVar1;
  pCVar9 = this->node_[0];
  if (bVar1 < (pCVar9->super_CordRep).storage[1]) {
LAB_0017dd5c:
    __assert_fail("index >= begin()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
  }
  if ((pCVar9->super_CordRep).storage[2] <= bVar1) {
LAB_0017dd1e:
    __assert_fail("index < end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
  }
  uVar10 = (((CordRepBtree *)pCVar9->edges_[uVar8])->super_CordRep).length;
  uVar12 = 0;
  pCVar4 = (CordRepBtree *)pCVar9->edges_[uVar8];
  if (uVar10 <= n) {
    pCVar5 = (CordRepBtree *)0x0;
    lVar15 = 0;
    do {
      n = n - uVar10;
      uVar8 = uVar8 + 1;
      uVar10 = (ulong)(pCVar9->super_CordRep).storage[2];
      if (uVar8 == uVar10) {
        iVar13 = (int)lVar15;
        iVar7 = this->height_;
        if (this->height_ < iVar13) {
          iVar7 = iVar13;
        }
        lVar11 = (long)iVar13;
        do {
          if (iVar7 == lVar11) goto LAB_0017dcfa;
          lVar15 = lVar11 + 1;
          pCVar9 = this->node_[lVar11 + 1];
          uVar8 = (ulong)this->index_[lVar11 + 1] + 1;
          uVar10 = (ulong)(pCVar9->super_CordRep).storage[2];
          lVar11 = lVar15;
        } while (uVar8 == uVar10);
      }
      uVar12 = (uint)lVar15;
      if (uVar8 < (pCVar9->super_CordRep).storage[1]) goto LAB_0017dd5c;
      if (uVar10 <= uVar8) goto LAB_0017dd1e;
      uVar10 = (((CordRepBtree *)pCVar9->edges_[uVar8])->super_CordRep).length;
      pCVar4 = (CordRepBtree *)pCVar9->edges_[uVar8];
    } while (uVar10 <= n);
  }
  pCVar5 = pCVar4;
  uVar6 = (uint8_t)uVar8;
  if (0 < (int)uVar12) {
    pCVar9 = pCVar5;
    uVar10 = (ulong)uVar12;
    do {
      if ((pCVar9->super_CordRep).tag != '\x03') {
        __assert_fail("IsBtree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                      ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
      }
      this->index_[uVar10] = (uint8_t)uVar8;
      this->node_[uVar10 - 1] = pCVar9;
      bVar1 = (pCVar9->super_CordRep).storage[1];
      uVar8 = (ulong)bVar1;
      bVar2 = (pCVar9->super_CordRep).storage[2];
      if (bVar2 <= bVar1) goto LAB_0017dd1e;
      pCVar5 = (CordRepBtree *)pCVar9->edges_[uVar8];
      uVar14 = (pCVar5->super_CordRep).length;
      if (uVar14 <= n) {
        do {
          if ((ulong)bVar2 - 1 == uVar8) {
            __assert_fail("index != node->end()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                          ,100,
                          "CordRepBtreeNavigator::Position absl::cord_internal::CordRepBtreeNavigator::Skip(size_t)"
                         );
          }
          n = n - uVar14;
          pCVar5 = (CordRepBtree *)pCVar9->edges_[uVar8 + 1];
          uVar14 = (pCVar5->super_CordRep).length;
          uVar8 = uVar8 + 1;
        } while (uVar14 <= n);
      }
      uVar6 = (uint8_t)uVar8;
      bVar3 = 1 < (long)uVar10;
      pCVar9 = pCVar5;
      uVar10 = uVar10 - 1;
    } while (bVar3);
  }
  this->index_[0] = uVar6;
LAB_0017dcfa:
  PVar16.offset = n;
  PVar16.edge = &pCVar5->super_CordRep;
  return PVar16;
}

Assistant:

CordRepBtreeNavigator::Position CordRepBtreeNavigator::Skip(size_t n) {
  int height = 0;
  size_t index = index_[0];
  CordRepBtree* node = node_[0];
  CordRep* edge = node->Edge(index);

  // Overall logic: Find an edge of at least the length we need to skip.
  // We consume all edges which are smaller (i.e., must be 100% skipped).
  // If we exhausted all edges on the current level, we move one level
  // up the tree, and repeat until we either find the edge, or until we hit
  // the top of the tree meaning the skip exceeds tree->length.
  while (n >= edge->length) {
    n -= edge->length;
    while (++index == node->end()) {
      if (++height > height_) return {nullptr, n};
      node = node_[height];
      index = index_[height];
    }
    edge = node->Edge(index);
  }

  // If we moved up the tree, descend down to the leaf level, consuming all
  // edges that must be skipped.
  while (height > 0) {
    node = edge->btree();
    index_[height] = static_cast<uint8_t>(index);
    node_[--height] = node;
    index = node->begin();
    edge = node->Edge(index);
    while (n >= edge->length) {
      n -= edge->length;
      ++index;
      assert(index != node->end());
      edge = node->Edge(index);
    }
  }
  index_[0] = static_cast<uint8_t>(index);
  return {edge, n};
}